

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

void __thiscall
t_rb_generator::generate_field_constructors
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct)

{
  bool bVar1;
  int iVar2;
  t_rb_ofstream *ptVar3;
  ostream *poVar4;
  reference pptVar5;
  string *psVar6;
  undefined4 extraout_var;
  string local_68 [8];
  string field_name;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_40;
  t_field **local_38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  t_rb_ofstream *out_local;
  t_rb_generator *this_local;
  
  ptVar3 = t_rb_ofstream::indent(out);
  poVar4 = std::operator<<((ostream *)ptVar3,"class << self");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_rb_ofstream::indent_up(out);
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  local_38 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_38;
  while( true ) {
    local_40._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (!bVar1) break;
    field_name.field_2._8_8_ =
         std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                   ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&field_name.field_2 + 8));
    if (bVar1) {
      std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    }
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string(local_68,(string *)psVar6);
    ptVar3 = t_rb_ofstream::indent(out);
    poVar4 = std::operator<<((ostream *)ptVar3,"def ");
    poVar4 = std::operator<<(poVar4,local_68);
    poVar4 = std::operator<<(poVar4,"(val)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    ptVar3 = t_rb_ofstream::indent(out);
    poVar4 = std::operator<<((ostream *)ptVar3,"  ");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar2));
    poVar4 = std::operator<<(poVar4,".new(:");
    poVar4 = std::operator<<(poVar4,local_68);
    poVar4 = std::operator<<(poVar4,", val)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    ptVar3 = t_rb_ofstream::indent(out);
    poVar4 = std::operator<<((ostream *)ptVar3,"end");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_68);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  t_rb_ofstream::indent_down(out);
  ptVar3 = t_rb_ofstream::indent(out);
  poVar4 = std::operator<<((ostream *)ptVar3,"end");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rb_generator::generate_field_constructors(t_rb_ofstream& out, t_struct* tstruct) {

  out.indent() << "class << self" << endl;
  out.indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (f_iter != fields.begin()) {
      out << endl;
    }
    std::string field_name = (*f_iter)->get_name();

    out.indent() << "def " << field_name << "(val)" << endl;
    out.indent() << "  " << tstruct->get_name() << ".new(:" << field_name << ", val)" << endl;
    out.indent() << "end" << endl;
  }

  out.indent_down();
  out.indent() << "end" << endl;

  out << endl;
}